

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
llvm::cl::TokenizeWindowsCommandLine
          (cl *this,StringRef Src,StringSaver *Saver,SmallVectorImpl<const_char_*> *NewArgv,
          bool MarkEOLs)

{
  StringRef Src_00;
  StringRef Src_01;
  StringRef Src_02;
  bool bVar1;
  char *local_190;
  StringRef local_188;
  StringRef local_178;
  char *local_168;
  StringSaver *local_160;
  char *local_158;
  StringSaver *local_150;
  char *local_148;
  char *local_140;
  StringRef local_138;
  StringRef local_128;
  char *local_118;
  StringSaver *local_110;
  char *local_108;
  char *local_100;
  char local_f1;
  char *pcStack_f0;
  char C;
  size_t E;
  size_t I;
  undefined1 local_d8 [4];
  anon_enum_32 State;
  SmallString<128U> Token;
  bool MarkEOLs_local;
  SmallVectorImpl<const_char_*> *NewArgv_local;
  StringSaver *Saver_local;
  StringRef Src_local;
  
  Src_local.Data = Src.Data;
  Token.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts[0x7f].
  super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)((byte)NewArgv & 1);
  Saver_local = (StringSaver *)this;
  SmallString<128U>::SmallString((SmallString<128U> *)local_d8);
  I._4_4_ = 0;
  Src_local.Length = (size_t)&Saver_local;
  pcStack_f0 = Src_local.Data;
  for (E = 0; (char *)E != pcStack_f0; E = E + 1) {
    local_f1 = StringRef::operator[]((StringRef *)&Saver_local,E);
    if (I._4_4_ == 0) {
      bVar1 = isWhitespace(local_f1);
      if (bVar1) {
        if ((((byte)Token.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                    InlineElts[0x7f].super_AlignedCharArray<1UL,_1UL>.buffer[0] & 1) != 0) &&
           (local_f1 == '\n')) {
          local_100 = (char *)0x0;
          SmallVectorTemplateBase<const_char_*,_true>::push_back
                    ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_100);
        }
      }
      else if (local_f1 == '\"') {
        I._4_4_ = 2;
      }
      else if (local_f1 == '\\') {
        local_110 = Saver_local;
        local_108 = Src_local.Data;
        Src_02.Length = (size_t)Src_local.Data;
        Src_02.Data = (char *)Saver_local;
        E = parseBackslash(Src_02,E,(SmallString<128U> *)local_d8);
        I._4_4_ = 1;
      }
      else {
        SmallVectorTemplateBase<char,_true>::push_back
                  ((SmallVectorTemplateBase<char,_true> *)local_d8,&local_f1);
        I._4_4_ = 1;
      }
    }
    else if (I._4_4_ == 1) {
      bVar1 = isWhitespace(local_f1);
      if (bVar1) {
        local_138 = SmallString::operator_cast_to_StringRef((SmallString *)local_d8);
        local_128 = StringSaver::save((StringSaver *)Src.Length,local_138);
        local_118 = local_128.Data;
        SmallVectorTemplateBase<const_char_*,_true>::push_back
                  ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_118);
        SmallVectorImpl<char>::clear((SmallVectorImpl<char> *)local_d8);
        I._4_4_ = 0;
        if ((((byte)Token.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                    InlineElts[0x7f].super_AlignedCharArray<1UL,_1UL>.buffer[0] & 1) != 0) &&
           (local_f1 == '\n')) {
          local_140 = (char *)0x0;
          SmallVectorTemplateBase<const_char_*,_true>::push_back
                    ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_140);
        }
      }
      else if (local_f1 == '\"') {
        I._4_4_ = 2;
      }
      else if (local_f1 == '\\') {
        local_150 = Saver_local;
        local_148 = Src_local.Data;
        Src_01.Length = (size_t)Src_local.Data;
        Src_01.Data = (char *)Saver_local;
        E = parseBackslash(Src_01,E,(SmallString<128U> *)local_d8);
      }
      else {
        SmallVectorTemplateBase<char,_true>::push_back
                  ((SmallVectorTemplateBase<char,_true> *)local_d8,&local_f1);
      }
    }
    else if (I._4_4_ == 2) {
      if (local_f1 == '\"') {
        I._4_4_ = 1;
      }
      else if (local_f1 == '\\') {
        local_160 = Saver_local;
        local_158 = Src_local.Data;
        Src_00.Length = (size_t)Src_local.Data;
        Src_00.Data = (char *)Saver_local;
        E = parseBackslash(Src_00,E,(SmallString<128U> *)local_d8);
      }
      else {
        SmallVectorTemplateBase<char,_true>::push_back
                  ((SmallVectorTemplateBase<char,_true> *)local_d8,&local_f1);
      }
    }
  }
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)local_d8);
  if (!bVar1) {
    local_188 = SmallString::operator_cast_to_StringRef((SmallString *)local_d8);
    local_178 = StringSaver::save((StringSaver *)Src.Length,local_188);
    local_168 = local_178.Data;
    SmallVectorTemplateBase<const_char_*,_true>::push_back
              ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_168);
  }
  if (((byte)Token.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts
             [0x7f].super_AlignedCharArray<1UL,_1UL>.buffer[0] & 1) != 0) {
    local_190 = (char *)0x0;
    SmallVectorTemplateBase<const_char_*,_true>::push_back
              ((SmallVectorTemplateBase<const_char_*,_true> *)Saver,&local_190);
  }
  SmallString<128U>::~SmallString((SmallString<128U> *)local_d8);
  return;
}

Assistant:

void cl::TokenizeWindowsCommandLine(StringRef Src, StringSaver &Saver,
                                    SmallVectorImpl<const char *> &NewArgv,
                                    bool MarkEOLs) {
  SmallString<128> Token;

  // This is a small state machine to consume characters until it reaches the
  // end of the source string.
  enum { INIT, UNQUOTED, QUOTED } State = INIT;
  for (size_t I = 0, E = Src.size(); I != E; ++I) {
    char C = Src[I];

    // INIT state indicates that the current input index is at the start of
    // the string or between tokens.
    if (State == INIT) {
      if (isWhitespace(C)) {
        // Mark the end of lines in response files
        if (MarkEOLs && C == '\n')
          NewArgv.push_back(nullptr);
        continue;
      }
      if (C == '"') {
        State = QUOTED;
        continue;
      }
      if (C == '\\') {
        I = parseBackslash(Src, I, Token);
        State = UNQUOTED;
        continue;
      }
      Token.push_back(C);
      State = UNQUOTED;
      continue;
    }

    // UNQUOTED state means that it's reading a token not quoted by double
    // quotes.
    if (State == UNQUOTED) {
      // Whitespace means the end of the token.
      if (isWhitespace(C)) {
        NewArgv.push_back(Saver.save(StringRef(Token)).data());
        Token.clear();
        State = INIT;
        // Mark the end of lines in response files
        if (MarkEOLs && C == '\n')
          NewArgv.push_back(nullptr);
        continue;
      }
      if (C == '"') {
        State = QUOTED;
        continue;
      }
      if (C == '\\') {
        I = parseBackslash(Src, I, Token);
        continue;
      }
      Token.push_back(C);
      continue;
    }

    // QUOTED state means that it's reading a token quoted by double quotes.
    if (State == QUOTED) {
      if (C == '"') {
        State = UNQUOTED;
        continue;
      }
      if (C == '\\') {
        I = parseBackslash(Src, I, Token);
        continue;
      }
      Token.push_back(C);
    }
  }
  // Append the last token after hitting EOF with no whitespace.
  if (!Token.empty())
    NewArgv.push_back(Saver.save(StringRef(Token)).data());
  // Mark the end of response files
  if (MarkEOLs)
    NewArgv.push_back(nullptr);
}